

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O2

void testMultiPartSharedAttributes(string *tempDir)

{
  int iVar1;
  int width;
  pointer pHVar2;
  pointer pHVar3;
  undefined4 uVar4;
  Attribute AVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ostream *poVar9;
  ChannelList *pCVar10;
  Box2i *pBVar11;
  string *psVar12;
  float *pfVar13;
  char *pcVar14;
  int height;
  int iVar15;
  size_t i;
  ulong uVar16;
  long lVar17;
  vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> headers;
  vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> headers_1;
  Header header;
  ChromaticitiesAttribute cca;
  TimeCodeAttribute tta;
  string fn;
  TimeCodeAttribute ta;
  TimeCode t;
  TimeCodeAttribute ta_1;
  TimeCode t_1;
  stringstream ss;
  float fStack_1b4;
  undefined1 local_1a8 [376];
  
  poVar9 = std::operator<<((ostream *)&std::cout,
                           "Testing multi part APIs : shared attributes, header... ");
  std::endl<char,std::char_traits<char>>(poVar9);
  random_reseed(1);
  std::operator+(&fn,tempDir,"imf_test_multipart_shared_attrs.exr");
  headers.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  headers.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  headers.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::clear(&headers);
  for (iVar15 = 0; iVar15 != 3; iVar15 = iVar15 + 1) {
    _ss = 0.0;
    fStack_1b4 = 0.0;
    Imf_2_5::Header::Header(&header,0xc5,0x107,1.0,(V2f *)&ss,1.0,INCREASING_Y,ZIP_COMPRESSION);
    iVar6 = random_int(3);
    iVar7 = random_int(2);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::ostream::operator<<(local_1a8,iVar15);
    std::__cxx11::stringbuf::str();
    Imf_2_5::Header::setName(&header,(string *)&cca);
    std::__cxx11::string::~string((string *)&cca);
    if (iVar6 == 0) {
      pCVar10 = Imf_2_5::Header::channels(&header);
      Imf_2_5::Channel::Channel((Channel *)&cca,UINT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar10,"UINT",(Channel *)&cca);
    }
    else if (iVar6 == 1) {
      pCVar10 = Imf_2_5::Header::channels(&header);
      Imf_2_5::Channel::Channel((Channel *)&cca,FLOAT,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar10,"FLOAT",(Channel *)&cca);
    }
    else if (iVar6 == 2) {
      pCVar10 = Imf_2_5::Header::channels(&header);
      Imf_2_5::Channel::Channel((Channel *)&cca,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar10,"HALF",(Channel *)&cca);
    }
    if (iVar7 == 1) {
      Imf_2_5::Header::setType(&header,(string *)Imf_2_5::TILEDIMAGE_abi_cxx11_);
      iVar6 = random_int(0xc5);
      iVar7 = random_int(0x107);
      cca._value.red.x = (float)random_int(3);
      if (2 < (uint)cca._value.red.x) {
        cca._value.red.x = 4.2039e-45;
      }
      cca.super_Attribute._vptr_Attribute._4_4_ = iVar7 + 1;
      cca.super_Attribute._vptr_Attribute._0_4_ = iVar6 + 1;
      cca._value.red.y = 0.0;
      Imf_2_5::Header::setTileDescription(&header,(TileDescription *)&cca);
    }
    else if (iVar7 == 0) {
      Imf_2_5::Header::setType(&header,(string *)Imf_2_5::SCANLINEIMAGE_abi_cxx11_);
    }
    std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back(&headers,&header);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    Imf_2_5::Header::~Header(&header);
  }
  remove(fn._M_dataplus._M_p);
  pHVar3 = headers.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pHVar2 = headers.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar15 = Imf_2_5::globalThreadCount();
  Imf_2_5::MultiPartOutputFile::MultiPartOutputFile
            ((MultiPartOutputFile *)&ss,fn._M_dataplus._M_p,pHVar2,
             (int)(((long)pHVar3 - (long)pHVar2) / 0x38),false,iVar15);
  Imf_2_5::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)&ss);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::vector(&headers_1,&headers);
  pBVar11 = Imf_2_5::Header::displayWindow
                      (headers_1.
                       super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl
                       .super__Vector_impl_data._M_start);
  iVar15 = (pBVar11->max).x;
  iVar6 = (pBVar11->max).y;
  iVar7 = (pBVar11->min).x;
  iVar1 = (pBVar11->min).y;
  height = (iVar6 - iVar1) + 10;
  width = (iVar15 - iVar7) + 10;
  if (iVar6 < iVar1 || iVar15 < iVar7) {
    height = 10;
    width = 10;
  }
  header._map._M_t._M_impl._0_8_ = 0;
  Imf_2_5::Header::Header
            ((Header *)&ss,width,height,1.0,(V2f *)&header,1.0,INCREASING_Y,ZIP_COMPRESSION);
  psVar12 = Imf_2_5::Header::type_abi_cxx11_
                      (headers_1.
                       super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl
                       .super__Vector_impl_data._M_start);
  Imf_2_5::Header::setType((Header *)&ss,psVar12);
  psVar12 = Imf_2_5::Header::name_abi_cxx11_
                      (headers_1.
                       super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl
                       .super__Vector_impl_data._M_start);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cca,"_newHeader",(allocator<char> *)&ta);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&header,
                 psVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cca);
  Imf_2_5::Header::setName((Header *)&ss,(string *)&header);
  std::__cxx11::string::~string((string *)&header);
  std::__cxx11::string::~string((string *)&cca);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
            (&headers_1,(value_type *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&header,"Shared Attributes : displayWindow : should fail for !=values",
             (allocator<char> *)&cca);
  anon_unknown.dwarf_195286::testMultiPartOutputFileForExpectedFailure
            (&headers_1,&fn,(string *)&header);
  std::__cxx11::string::~string((string *)&header);
  Imf_2_5::Header::~Header((Header *)&ss);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::~vector(&headers_1);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::vector(&headers_1,&headers);
  Imf_2_5::Header::displayWindow
            (headers_1.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl
             .super__Vector_impl_data._M_start);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size((Box<Imath_2_5::Vec2<int>_> *)&header);
  uVar4 = header._map._M_t._M_impl._0_4_;
  Imf_2_5::Header::displayWindow
            (headers_1.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl
             .super__Vector_impl_data._M_start);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::size((Box<Imath_2_5::Vec2<int>_> *)&cca);
  iVar15 = cca.super_Attribute._vptr_Attribute._4_4_;
  pfVar13 = Imf_2_5::Header::pixelAspectRatio
                      (headers_1.
                       super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl
                       .super__Vector_impl_data._M_start);
  ta.super_Attribute._vptr_Attribute = (_func_int **)0x0;
  Imf_2_5::Header::Header
            ((Header *)&ss,uVar4 + 1,iVar15 + 1,*pfVar13 + 1.0,(V2f *)&ta,1.0,INCREASING_Y,
             ZIP_COMPRESSION);
  psVar12 = Imf_2_5::Header::type_abi_cxx11_
                      (headers_1.
                       super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl
                       .super__Vector_impl_data._M_start);
  Imf_2_5::Header::setType((Header *)&ss,psVar12);
  psVar12 = Imf_2_5::Header::name_abi_cxx11_
                      (headers_1.
                       super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl
                       .super__Vector_impl_data._M_start);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cca,"_newHeader",(allocator<char> *)&ta);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&header,
                 psVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cca);
  Imf_2_5::Header::setName((Header *)&ss,(string *)&header);
  std::__cxx11::string::~string((string *)&header);
  std::__cxx11::string::~string((string *)&cca);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
            (&headers_1,(value_type *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&header,"Shared Attributes : pixelAspecRatio : should fail for !=values",
             (allocator<char> *)&cca);
  anon_unknown.dwarf_195286::testMultiPartOutputFileForExpectedFailure
            (&headers_1,&fn,(string *)&header);
  std::__cxx11::string::~string((string *)&header);
  Imf_2_5::Header::~Header((Header *)&ss);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::~vector(&headers_1);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::vector(&headers_1,&headers);
  Imf_2_5::Header::Header
            ((Header *)&ss,
             headers_1.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl
             .super__Vector_impl_data._M_start);
  psVar12 = Imf_2_5::Header::name_abi_cxx11_
                      (headers_1.
                       super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl
                       .super__Vector_impl_data._M_start);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cca,"_newHeader",(allocator<char> *)&ta);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&header,
                 psVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cca);
  Imf_2_5::Header::setName((Header *)&ss,(string *)&header);
  std::__cxx11::string::~string((string *)&header);
  std::__cxx11::string::~string((string *)&cca);
  Imf_2_5::TimeCode::TimeCode(&t,0x12d687,0,TV60_PACKING);
  Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>::TypedAttribute(&ta,&t);
  pcVar14 = Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>::staticTypeName();
  Imf_2_5::Header::insert((Header *)&ss,pcVar14,&ta.super_Attribute);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
            (&headers_1,(value_type *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&header,"Shared Attributes : timecode : should fail for !presence",
             (allocator<char> *)&cca);
  anon_unknown.dwarf_195286::testMultiPartOutputFileForExpectedFailure
            (&headers_1,&fn,(string *)&header);
  std::__cxx11::string::~string((string *)&header);
  lVar17 = 0;
  for (uVar16 = 0;
      pHVar2 = headers_1.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar16 < (ulong)(((long)headers_1.
                              super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)headers_1.
                             super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>.
                             _M_impl.super__Vector_impl_data._M_start) / 0x38); uVar16 = uVar16 + 1)
  {
    pcVar14 = Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>::staticTypeName();
    Imf_2_5::Header::insert
              ((Header *)(&(pHVar2->_map)._M_t._M_impl.field_0x0 + lVar17),pcVar14,
               &ta.super_Attribute);
    lVar17 = lVar17 + 0x38;
  }
  uVar8 = Imf_2_5::TimeCode::timeAndFlags(&t,TV60_PACKING);
  Imf_2_5::TimeCode::setTimeAndFlags(&t,uVar8 + 1,TV60_PACKING);
  Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>::TypedAttribute(&tta,&t);
  pcVar14 = Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>::staticTypeName();
  Imf_2_5::Header::insert((Header *)&ss,pcVar14,&tta.super_Attribute);
  psVar12 = Imf_2_5::Header::name_abi_cxx11_((Header *)&ss);
  std::__cxx11::string::string<std::allocator<char>>((string *)&cca,"_+1",(allocator<char> *)&ta_1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&header,
                 psVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cca);
  Imf_2_5::Header::setName((Header *)&ss,(string *)&header);
  std::__cxx11::string::~string((string *)&header);
  std::__cxx11::string::~string((string *)&cca);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
            (&headers_1,(value_type *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&header,"Shared Attributes : timecode : should fail for != values",
             (allocator<char> *)&cca);
  anon_unknown.dwarf_195286::testMultiPartOutputFileForExpectedFailure
            (&headers_1,&fn,(string *)&header);
  std::__cxx11::string::~string((string *)&header);
  Imf_2_5::Attribute::~Attribute(&tta.super_Attribute);
  Imf_2_5::Attribute::~Attribute(&ta.super_Attribute);
  Imf_2_5::Header::~Header((Header *)&ss);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::~vector(&headers_1);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::vector
            ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&tta,&headers);
  Imf_2_5::Header::Header((Header *)&ss,(Header *)tta.super_Attribute._vptr_Attribute);
  psVar12 = Imf_2_5::Header::name_abi_cxx11_((Header *)tta.super_Attribute._vptr_Attribute);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cca,"_newHeader",(allocator<char> *)&headers_1);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&header,
                 psVar12,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cca);
  Imf_2_5::Header::setName((Header *)&ss,(string *)&header);
  std::__cxx11::string::~string((string *)&header);
  std::__cxx11::string::~string((string *)&cca);
  header._map._M_t._M_impl._0_8_ = 0x3ea8f5c33f23d70a;
  cca.super_Attribute._vptr_Attribute = (_func_int **)0x3f19999a3e99999a;
  ta.super_Attribute._vptr_Attribute = (_func_int **)0x3d75c28f3e19999a;
  t._time = 0x3ea01a37;
  t._user = 0x3ea872b0;
  Imf_2_5::Chromaticities::Chromaticities
            ((Chromaticities *)&headers_1,(V2f *)&header,(V2f *)&cca,(V2f *)&ta,(V2f *)&t);
  Imf_2_5::TypedAttribute<Imf_2_5::Chromaticities>::TypedAttribute
            ((TypedAttribute<Imf_2_5::Chromaticities> *)&header,(Chromaticities *)&headers_1);
  pcVar14 = Imf_2_5::TypedAttribute<Imf_2_5::Chromaticities>::staticTypeName();
  Imf_2_5::Header::insert((Header *)&ss,pcVar14,(Attribute *)&header);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
            ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&tta,(value_type *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cca,"Shared Attributes : chromaticities : should fail for !present",
             (allocator<char> *)&ta);
  anon_unknown.dwarf_195286::testMultiPartOutputFileForExpectedFailure
            ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&tta,&fn,(string *)&cca);
  std::__cxx11::string::~string((string *)&cca);
  lVar17 = 0;
  for (uVar16 = 0; AVar5._vptr_Attribute = tta.super_Attribute._vptr_Attribute,
      uVar16 < (ulong)(((long)tta._value - (long)tta.super_Attribute._vptr_Attribute) / 0x38);
      uVar16 = uVar16 + 1) {
    pcVar14 = Imf_2_5::TypedAttribute<Imf_2_5::Chromaticities>::staticTypeName();
    Imf_2_5::Header::insert
              ((Header *)((long)AVar5._vptr_Attribute + lVar17),pcVar14,(Attribute *)&header);
    lVar17 = lVar17 + 0x38;
  }
  headers_1.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44((float)((ulong)headers_1.
                                        super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 0x20) + 1.0,
                         SUB84(headers_1.
                               super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>
                               ._M_impl.super__Vector_impl_data._M_start,0) + 1.0);
  Imf_2_5::TypedAttribute<Imf_2_5::Chromaticities>::TypedAttribute
            (&cca,(Chromaticities *)&headers_1);
  pcVar14 = Imf_2_5::TypedAttribute<Imf_2_5::Chromaticities>::staticTypeName();
  Imf_2_5::Header::insert((Header *)&ss,pcVar14,&cca.super_Attribute);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
            ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&tta,(value_type *)&ss);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ta,"Shared Attributes : chromaticities : should fail for != values",
             (allocator<char> *)&t);
  anon_unknown.dwarf_195286::testMultiPartOutputFileForExpectedFailure
            ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&tta,&fn,(string *)&ta);
  std::__cxx11::string::~string((string *)&ta);
  Imf_2_5::Attribute::~Attribute(&cca.super_Attribute);
  Imf_2_5::Attribute::~Attribute((Attribute *)&header);
  Imf_2_5::Header::~Header((Header *)&ss);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::~vector
            ((vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_> *)&tta);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::~vector(&headers);
  headers.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  headers.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  headers.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"Header : empty header list passed",(allocator<char> *)&header);
  anon_unknown.dwarf_195286::testMultiPartOutputFileForExpectedFailure(&headers,&fn,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  _ss = 0.0;
  fStack_1b4 = 0.0;
  Imf_2_5::Header::Header(&header,0x40,0x40,1.0,(V2f *)&ss,1.0,INCREASING_Y,ZIP_COMPRESSION);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back(&headers,&header);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"Header : empty image type passed",(allocator<char> *)&cca);
  anon_unknown.dwarf_195286::testMultiPartOutputFileForExpectedFailure(&headers,&fn,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  Imf_2_5::Header::setType
            (headers.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
             super__Vector_impl_data._M_start,(string *)Imf_2_5::SCANLINEIMAGE_abi_cxx11_);
  Imf_2_5::Header::Header
            ((Header *)&cca,
             headers.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
             super__Vector_impl_data._M_start);
  std::vector<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>::push_back
            (&headers,(value_type *)&cca);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"Header: duplicate header names passed",(allocator<char> *)&headers_1);
  anon_unknown.dwarf_195286::testMultiPartOutputFileForExpectedFailure(&headers,&fn,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  pHVar2 = headers.super__Vector_base<Imf_2_5::Header,_std::allocator<Imf_2_5::Header>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ss,"invalid image type",(allocator<char> *)&headers_1);
  Imf_2_5::Header::setType(pHVar2,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  poVar9 = std::operator<<((ostream *)&std::cerr,"Header : unsupported image type passed");
  std::endl<char,std::char_traits<char>>(poVar9);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testMultiPartSharedAttributes.cpp"
                ,0x183,"void (anonymous namespace)::testHeaders(const std::string &)");
}

Assistant:

void
testMultiPartSharedAttributes (const std::string & tempDir)
{
    try
    {
        cout << "Testing multi part APIs : shared attributes, header... " << endl;

        random_reseed(1);

        std::string fn = tempDir +  "imf_test_multipart_shared_attrs.exr";

        testSharedAttributes (fn);
        testHeaders (fn);

        cout << " ... ok\n" << endl;
    }
    catch (const IEX_NAMESPACE::BaseExc & e)
    {
        cerr << "ERROR -- caught IEX_NAMESPACE::BaseExc exception: " << e.what() << endl;
        assert (false);
    }
    catch (const std::exception & e)
    {
        cerr << "ERROR -- caught std::exception exception: " << e.what() << endl;
        assert (false);
    }
}